

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skybox.cpp
# Opt level: O0

void __thiscall Skybox::initSkybox(Skybox *this)

{
  undefined1 local_1c8 [8];
  float vertices [108];
  Skybox *this_local;
  
  memcpy(local_1c8,&DAT_001aedd0,0x1b0);
  (*__glewGenVertexArrays)(1,&this->skyboxVAO);
  (*__glewGenBuffers)(1,&this->skyboxVBO);
  (*__glewBindVertexArray)(this->skyboxVAO);
  (*__glewBindBuffer)(0x8892,this->skyboxVBO);
  (*__glewBufferData)(0x8892,0x1b0,local_1c8,0x88e4);
  (*__glewEnableVertexAttribArray)(0);
  (*__glewVertexAttribPointer)(0,3,0x1406,'\0',0xc,(void *)0x0);
  (*__glewBindVertexArray)(0);
  return;
}

Assistant:

void Skybox::initSkybox() {
	float vertices[] = {
		-1.0f,  1.0f, -1.0f,
		-1.0f, -1.0f, -1.0f,
		1.0f, -1.0f, -1.0f,
		1.0f, -1.0f, -1.0f,
		1.0f,  1.0f, -1.0f,
		-1.0f,  1.0f, -1.0f,

		-1.0f, -1.0f,  1.0f,
		-1.0f, -1.0f, -1.0f,
		-1.0f,  1.0f, -1.0f,
		-1.0f,  1.0f, -1.0f,
		-1.0f,  1.0f,  1.0f,
		-1.0f, -1.0f,  1.0f,

		1.0f, -1.0f, -1.0f,
		1.0f, -1.0f,  1.0f,
		1.0f,  1.0f,  1.0f,
		1.0f,  1.0f,  1.0f,
		1.0f,  1.0f, -1.0f,
		1.0f, -1.0f, -1.0f,

		-1.0f, -1.0f,  1.0f,
		-1.0f,  1.0f,  1.0f,
		1.0f,  1.0f,  1.0f,
		1.0f,  1.0f,  1.0f,
		1.0f, -1.0f,  1.0f,
		-1.0f, -1.0f,  1.0f,

		-1.0f,  1.0f, -1.0f,
		1.0f,  1.0f, -1.0f,
		1.0f,  1.0f,  1.0f,
		1.0f,  1.0f,  1.0f,
		-1.0f,  1.0f,  1.0f,
		-1.0f,  1.0f, -1.0f,

		-1.0f, -1.0f, -1.0f,
		-1.0f, -1.0f,  1.0f,
		1.0f, -1.0f, -1.0f,
		1.0f, -1.0f, -1.0f,
		-1.0f, -1.0f,  1.0f,
		1.0f, -1.0f,  1.0f
	};

	glGenVertexArrays(1, &skyboxVAO);
	glGenBuffers(1, &skyboxVBO);

	glBindVertexArray(skyboxVAO);

	// Vertices attribute
	glBindBuffer(GL_ARRAY_BUFFER, skyboxVBO);
	glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);
	glEnableVertexAttribArray(0);
	glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 3 * sizeof(GLfloat), (GLvoid*)0);
	glBindVertexArray(0);
}